

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTreeEdge.cpp
# Opt level: O3

shared_ptr<Bipartition> __thiscall PhyloTreeEdge::getOriginalEdge(PhyloTreeEdge *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<Bipartition> sVar2;
  shared_ptr<Bipartition> sVar3;
  
  in_RDI->_vptr_Bipartition =
       (_func_int **)
       (this->originalEdge).super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->originalEdge).super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (in_RDI->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      sVar2.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<Bipartition>)
             sVar2.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi
  ;
  sVar3.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Bipartition>)sVar3.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const shared_ptr<Bipartition> PhyloTreeEdge::getOriginalEdge() {
    return originalEdge;
}